

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItemSimilarityRecommender.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::ItemSimilarityRecommender::ByteSizeLong(ItemSimilarityRecommender *this)

{
  uint uVar1;
  string *psVar2;
  Type *value;
  size_t sVar3;
  uint i;
  uint index;
  ulong uVar4;
  
  uVar1 = (this->itemitemsimilarities_).super_RepeatedPtrFieldBase.current_size_;
  uVar4 = (ulong)uVar1;
  for (index = 0; uVar1 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>::TypeHandler>
                      (&(this->itemitemsimilarities_).super_RepeatedPtrFieldBase,index);
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::ItemSimilarityRecommender_SimilarItems>
                      (value);
    uVar4 = uVar4 + sVar3;
  }
  psVar2 = (this->iteminputfeaturename_).ptr_;
  if (psVar2->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar2);
    uVar4 = uVar4 + sVar3 + 1;
  }
  psVar2 = (this->numrecommendationsinputfeaturename_).ptr_;
  if (psVar2->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar2);
    uVar4 = uVar4 + sVar3 + 1;
  }
  psVar2 = (this->itemrestrictioninputfeaturename_).ptr_;
  if (psVar2->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar2);
    uVar4 = uVar4 + sVar3 + 1;
  }
  psVar2 = (this->itemexclusioninputfeaturename_).ptr_;
  if (psVar2->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar2);
    uVar4 = uVar4 + sVar3 + 1;
  }
  psVar2 = (this->recommendeditemlistoutputfeaturename_).ptr_;
  if (psVar2->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar2);
    uVar4 = uVar4 + sVar3 + 2;
  }
  psVar2 = (this->recommendeditemscoreoutputfeaturename_).ptr_;
  if (psVar2->_M_string_length != 0) {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar2);
    uVar4 = uVar4 + sVar3 + 2;
  }
  if (this->itemstringids_ != (StringVector *)0x0 &&
      this != (ItemSimilarityRecommender *)&_ItemSimilarityRecommender_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::StringVector>(this->itemstringids_);
    uVar4 = uVar4 + sVar3 + 1;
  }
  if (this->itemint64ids_ != (Int64Vector *)0x0 &&
      this != (ItemSimilarityRecommender *)&_ItemSimilarityRecommender_default_instance_) {
    sVar3 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Int64Vector>(this->itemint64ids_);
    uVar4 = uVar4 + sVar3 + 1;
  }
  this->_cached_size_ = (int)uVar4;
  return uVar4;
}

Assistant:

size_t ItemSimilarityRecommender::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.ItemSimilarityRecommender)
  size_t total_size = 0;

  // repeated .CoreML.Specification.ItemSimilarityRecommender.SimilarItems itemItemSimilarities = 1;
  {
    unsigned int count = this->itemitemsimilarities_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->itemitemsimilarities(i));
    }
  }

  // string itemInputFeatureName = 10;
  if (this->iteminputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->iteminputfeaturename());
  }

  // string numRecommendationsInputFeatureName = 11;
  if (this->numrecommendationsinputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->numrecommendationsinputfeaturename());
  }

  // string itemRestrictionInputFeatureName = 12;
  if (this->itemrestrictioninputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->itemrestrictioninputfeaturename());
  }

  // string itemExclusionInputFeatureName = 13;
  if (this->itemexclusioninputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->itemexclusioninputfeaturename());
  }

  // string recommendedItemListOutputFeatureName = 20;
  if (this->recommendeditemlistoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->recommendeditemlistoutputfeaturename());
  }

  // string recommendedItemScoreOutputFeatureName = 21;
  if (this->recommendeditemscoreoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->recommendeditemscoreoutputfeaturename());
  }

  // .CoreML.Specification.StringVector itemStringIds = 2;
  if (this->has_itemstringids()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->itemstringids_);
  }

  // .CoreML.Specification.Int64Vector itemInt64Ids = 3;
  if (this->has_itemint64ids()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->itemint64ids_);
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}